

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_hash.c
# Opt level: O1

hash hash_callback_str(hash_key key)

{
  char cVar1;
  hash hVar2;
  char *pcVar3;
  
  if (*key != '\0') {
    pcVar3 = (char *)((long)key + 1);
    hVar2 = 0x1505;
    do {
      cVar1 = *pcVar3;
      hVar2 = hVar2 * 0x21 + (long)cVar1;
      pcVar3 = pcVar3 + 1;
    } while ((long)cVar1 != 0);
    return hVar2;
  }
  return 0x1505;
}

Assistant:

hash hash_callback_str(const hash_key key)
{
	/* djb2 */
	const char *str = (const char *)key;

	hash h = 0x1505;

	while (*str++ != '\0')
	{
		h = (hash)(((h << 5) + h) + *str);
	}

	return h;
}